

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_address.cpp
# Opt level: O2

ElementsConfidentialAddress * __thiscall
cfd::core::ElementsConfidentialAddress::operator=
          (ElementsConfidentialAddress *this,ElementsConfidentialAddress *object)

{
  if (this != object) {
    core::Address::operator=(&this->unblinded_address_,&object->unblinded_address_);
    ByteData::operator=(&(this->confidential_key_).data_,&(object->confidential_key_).data_);
    ::std::__cxx11::string::_M_assign((string *)&this->address_);
  }
  return this;
}

Assistant:

ElementsConfidentialAddress& ElementsConfidentialAddress::operator=(
    const ElementsConfidentialAddress& object) & {
  if (this != &object) {
    unblinded_address_ = object.unblinded_address_;
    confidential_key_ = object.confidential_key_;
    address_ = object.address_;
  }
  return *this;
}